

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::existsCompatibleMatch
          (ClauseMatcher *this,ILStruct *si,MatchInfo *sq,ILStruct *targets)

{
  uint uVar1;
  bool bVar2;
  long in_RCX;
  ILStruct *in_RDX;
  MatchInfo *in_RSI;
  ILStruct *in_RDI;
  ILStruct *unaff_retaddr;
  ClauseMatcher *in_stack_00000008;
  size_t i;
  size_t tcnt;
  ulong local_38;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar1 = *(uint *)(in_RCX + 0x34);
  local_38 = 0;
  while( true ) {
    if (uVar1 <= local_38) {
      return false;
    }
    CodeTree::ILStruct::getMatch(in_RDX,(uint)((ulong)in_RSI >> 0x20));
    bVar2 = compatible(in_stack_00000008,unaff_retaddr,
                       (MatchInfo *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI);
    if (bVar2) break;
    local_38 = local_38 + 1;
  }
  return true;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::existsCompatibleMatch(ILStruct* si, MatchInfo* sq, ILStruct* targets)
{
  size_t tcnt=targets->matchCnt;
  for(size_t i=0;i<tcnt;i++) {
    if(compatible(si,sq,targets,targets->getMatch(i))) {
      return true;
    }
  }
  return false;
}